

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

void __thiscall gl4cts::ShaderSubroutine::NegativeTest9::deinit(NegativeTest9 *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_po_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x448))();
    this->m_po_id = 0;
  }
  if (this->m_vs_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x470))();
    this->m_vs_id = 0;
  }
  return;
}

Assistant:

void NegativeTest9::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);

		m_po_id = 0;
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);

		m_vs_id = 0;
	}
}